

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O3

void defaultPanic(TidyAllocator *allocator,ctmbstr msg)

{
  ctmbstr ptVar1;
  
  if (g_panic != (TidyPanic)0x0) {
    (*g_panic)(msg);
    return;
  }
  ptVar1 = msg;
  defaultPanic_cold_1();
  *(code **)(ptVar1 + 8) = insrc_getByte;
  *(code **)(ptVar1 + 0x18) = insrc_eof;
  *(code **)(ptVar1 + 0x10) = insrc_ungetByte;
  *(ctmbstr *)ptVar1 = msg;
  return;
}

Assistant:

static void TIDY_CALL defaultPanic( TidyAllocator* ARG_UNUSED(allocator), ctmbstr msg )
{
  if ( g_panic )
    g_panic( msg );
  else
  {
    /* 2 signifies a serious error */
    fprintf( stderr, "Fatal error: %s\n", msg );
#ifdef _DEBUG
    assert(0);
#endif
    exit(2);
  }
}